

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O1

bool __thiscall Gaussian::Iterate(Gaussian *this)

{
  pointer paVar1;
  undefined8 uVar2;
  int iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  bool bVar6;
  key_type local_14;
  
  iVar3 = GaussianOrder(&this->ijk);
  uVar5 = (long)iVar3 + 1;
  pmVar4 = std::
           map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
           ::at((map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
                 *)&gorder_map,&local_14);
  paVar1 = (pmVar4->super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)(((long)(pmVar4->
                             super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 2) *
                     -0x5555555555555555)) {
    uVar2 = *(undefined8 *)paVar1[uVar5]._M_elems;
    *(undefined8 *)(this->ijk)._M_elems = uVar2;
    (this->ijk)._M_elems[2] = paVar1[uVar5]._M_elems[2];
    bVar6 = false;
    if ((-1 < (int)uVar2) && (-1 < (this->ijk)._M_elems[1])) {
      bVar6 = -1 < (this->ijk)._M_elems[2];
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Iterate(void)
    {
        size_t idx = static_cast<size_t>(index()) + 1;
        const auto & v = gorder_map.at(am());

        if(idx >= v.size())
            return false;
        else
        {
            ijk = v.at(idx);
            return *this;
        }
    }